

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O0

void __thiscall OpenSSLWrapper::SslConnection::SSLSetConnectState(SslConnection *this)

{
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lk;
  SslConnection *this_local;
  
  lk._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->m_mxSsl);
  SSL_set_connect_state((SSL *)this->m_ssl);
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return;
}

Assistant:

void SslConnection::SSLSetConnectState()
    {
        lock_guard<mutex> lk(m_mxSsl);
        SSL_set_connect_state(m_ssl);
    }